

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zeRTASParallelOperationCreateExt
          (ze_driver_handle_t hDriver,ze_rtas_parallel_operation_ext_handle_t *phParallelOperation)

{
  ze_result_t zVar1;
  
  if (DAT_0010e120 != (code *)0x0) {
    zVar1 = (*DAT_0010e120)();
    return zVar1;
  }
  context_t::get()::count =
       (ze_rtas_parallel_operation_ext_handle_t)((long)context_t::get()::count + 1);
  *phParallelOperation = context_t::get()::count;
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASParallelOperationCreateExt(
        ze_driver_handle_t hDriver,                     ///< [in] handle of driver object
        ze_rtas_parallel_operation_ext_handle_t* phParallelOperation///< [out] handle of parallel operation object
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCreateExt = context.zeDdiTable.RTASParallelOperation.pfnCreateExt;
        if( nullptr != pfnCreateExt )
        {
            result = pfnCreateExt( hDriver, phParallelOperation );
        }
        else
        {
            // generic implementation
            *phParallelOperation = reinterpret_cast<ze_rtas_parallel_operation_ext_handle_t>( context.get() );

        }

        return result;
    }